

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O1

void __thiscall
libtorrent::anon_unknown_5::to_string_visitor::operator()(to_string_visitor *this,list_type *l)

{
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  *pvVar1;
  bool bVar2;
  entry *item;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  *__variants;
  
  ::std::__cxx11::string::append((char *)this->out);
  this->indent = this->indent + 1;
  __variants = &((l->super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start)->super_variant_type;
  pvVar1 = &((l->super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>)._M_impl.
             super__Vector_impl_data._M_finish)->super_variant_type;
  if (__variants != pvVar1) {
    bVar2 = true;
    do {
      if (!bVar2) {
        ::std::__cxx11::string::append((char *)this->out);
      }
      if (this->single_line == false) {
        ::std::__cxx11::string::resize
                  ((ulong)this->out,(char)this->indent + (char)this->out->_M_string_length);
      }
      ::std::
      visit<libtorrent::(anonymous_namespace)::to_string_visitor&,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                (this,__variants);
      __variants = __variants + 1;
      bVar2 = false;
    } while (__variants != pvVar1);
  }
  ::std::__cxx11::string::append((char *)this->out);
  this->indent = this->indent + -1;
  return;
}

Assistant:

void operator()(entry::list_type const& l)
		{
			out += single_line ? "[ " : "[\n";
			bool first = true;
			++indent;
			for (auto const& item : l)
			{
				if (!first) out += single_line ? ", " : ",\n";
				first = false;
				if (!single_line) add_indent(out, indent);

				std::visit(*this, static_cast<entry::variant_type const&>(item));
			}
			out += " ]";
			--indent;
		}